

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TopicTree.h
# Opt level: O0

void __thiscall uWS::TopicTree::~TopicTree(TopicTree *this)

{
  long in_RDI;
  Topic *this_00;
  
  this_00 = *(Topic **)(in_RDI + 0x20);
  if (this_00 != (Topic *)0x0) {
    Topic::~Topic(this_00);
    operator_delete(this_00,0xc0);
  }
  std::
  function<int_(uWS::Subscriber_*,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>)>
  ::~function((function<int_(uWS::Subscriber_*,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>)>
               *)0x23c263);
  return;
}

Assistant:

~TopicTree() {
        delete root;
    }